

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqast.h
# Opt level: O2

void __thiscall SQCompilation::CommaExpr::addExpression(CommaExpr *this,Expr *expr)

{
  ulong uVar1;
  Expr *local_8;
  
  uVar1 = (ulong)((this->_exprs)._size != 0);
  (&(this->super_Expr).super_Node._coordinates.lineStart)[uVar1 * 2] =
       (&(expr->super_Node)._coordinates.lineStart)[uVar1 * 2];
  (&(this->super_Expr).super_Node._coordinates.columnStart)[uVar1 * 2] =
       (&(expr->super_Node)._coordinates.columnStart)[uVar1 * 2];
  local_8 = expr;
  ArenaVector<SQCompilation::Expr_*>::push_back(&this->_exprs,&local_8);
  return;
}

Assistant:

void addExpression(Expr *expr) {
      if (_exprs.empty()) {
        setLineStartPos(expr->lineStart());
        setColumnStartPos(expr->columnStart());
      }
      else {
        setLineEndPos(expr->lineEnd());
        setColumnEndPos(expr->columnEnd());
      }

      _exprs.push_back(expr);
    }